

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewdialog.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_20c5e7::LineEdit::~LineEdit(LineEdit *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR_metaObject_00167fb8;
  *(undefined ***)&this->field_0x10 = &PTR__LineEdit_00168170;
  pDVar1 = (this->origText).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->origText).d.d)->super_QArrayData,2,0x10);
    }
  }
  QLineEdit::~QLineEdit(&this->super_QLineEdit);
  operator_delete(this,0x40);
  return;
}

Assistant:

Q_OBJECT
public:
    LineEdit(QWidget* parent = nullptr)
        : QLineEdit(parent)
    {
        setContextMenuPolicy(Qt::NoContextMenu);
        connect(this, &LineEdit::returnPressed, this, &LineEdit::handleReturnPressed);
    }